

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.c
# Opt level: O2

void sysbvm_function_registerPrimitives(void)

{
  sysbvm_primitiveTable_registerFunction(sysbvm_function_primitive_apply,"Function::apply");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_function_primitive_applyWithArguments,"Function::applyWithArguments:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_function_primitive_applyWithExpandedArguments,
             "Function::applyWithExpandedArguments:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_function_primitive_adoptDefinitionOf,"Function::adoptDefinitionOf");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_function_primitive_isBootstrapPrimitive,"Function::isBootstrapPrimitive");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_function_primitive_hasVirtualDispatch,"Function::hasVirtualDispatch");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_function_primitive_hasOverrideDispatch,"Function::hasOverrideDispatch");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_function_primitive_recompileAndOptimize,"Function::recompileAndOptimize");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_function_primitive_recordBindingWithOwnerAndName,
             "Function::recordBindingWithOwner:andName:");
  return;
}

Assistant:

void sysbvm_function_registerPrimitives(void)
{
    sysbvm_primitiveTable_registerFunction(sysbvm_function_primitive_apply, "Function::apply");
    sysbvm_primitiveTable_registerFunction(sysbvm_function_primitive_applyWithArguments, "Function::applyWithArguments:");
    sysbvm_primitiveTable_registerFunction(sysbvm_function_primitive_applyWithExpandedArguments, "Function::applyWithExpandedArguments:");
    sysbvm_primitiveTable_registerFunction(sysbvm_function_primitive_adoptDefinitionOf, "Function::adoptDefinitionOf");
    sysbvm_primitiveTable_registerFunction(sysbvm_function_primitive_isBootstrapPrimitive, "Function::isBootstrapPrimitive");
    sysbvm_primitiveTable_registerFunction(sysbvm_function_primitive_hasVirtualDispatch, "Function::hasVirtualDispatch");
    sysbvm_primitiveTable_registerFunction(sysbvm_function_primitive_hasOverrideDispatch, "Function::hasOverrideDispatch");
    sysbvm_primitiveTable_registerFunction(sysbvm_function_primitive_recompileAndOptimize, "Function::recompileAndOptimize");
    sysbvm_primitiveTable_registerFunction(sysbvm_function_primitive_recordBindingWithOwnerAndName, "Function::recordBindingWithOwner:andName:");
}